

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O1

int ply_add_obj_info(p_ply ply,char *obj_info)

{
  size_t sVar1;
  char *__dest;
  
  if (((ply != (p_ply)0x0) && (obj_info != (char *)0x0)) &&
     (sVar1 = strlen(obj_info), sVar1 < 0x400)) {
    __dest = (char *)ply_grow_array(ply,&ply->obj_info,&ply->nobj_infos,0x400);
    if (__dest != (char *)0x0) {
      strcpy(__dest,obj_info);
    }
    return (uint)(__dest != (char *)0x0);
  }
  __assert_fail("ply && obj_info && strlen(obj_info) < LINESIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x24f,"int ply_add_obj_info(p_ply, const char *)");
}

Assistant:

int ply_add_obj_info(p_ply ply, const char *obj_info) {
    char *new_obj_info = NULL;
    assert(ply && obj_info && strlen(obj_info) < LINESIZE);
    if (!obj_info || strlen(obj_info) >= LINESIZE) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    new_obj_info = (char *) ply_grow_array(ply, (void **) &ply->obj_info,
            &ply->nobj_infos, LINESIZE);
    if (!new_obj_info) return 0;
    strcpy(new_obj_info, obj_info);
    return 1;
}